

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall
cs::translator_type::match_grammar
          (translator_type *this,context_t *context,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  long *plVar3;
  _Map_pointer ppptVar4;
  _Map_pointer ppptVar5;
  token_base *ptVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  action_types *paVar10;
  _Elt_pointer pptVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  token_base **pptVar15;
  long lVar16;
  token_base **it;
  long *plVar17;
  bool bVar18;
  long local_58;
  long *local_50;
  
  p_Var1 = (this->m_data).
           super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)this) {
      return;
    }
    sVar2 = *(size_t *)
             &((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                *)(p_Var1 + 1))->
              super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
    ;
    plVar17 = *(long **)(sVar2 + 0x10);
    plVar3 = *(long **)(sVar2 + 0x30);
    if (plVar17 == plVar3) {
      bVar18 = false;
      uVar12 = 0;
LAB_0012b500:
      ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if ((((long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)ppptVar4 -
                     (long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <= uVar12) && (bVar18)) {
LAB_0012b54c:
        sVar2 = *(size_t *)
                 &((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                    *)(p_Var1 + 1))->
                  super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
        ;
        plVar17 = *(long **)(sVar2 + 0x10);
        plVar3 = *(long **)(sVar2 + 0x30);
        if (plVar17 != plVar3) {
          local_50 = *(long **)(sVar2 + 0x20);
          local_58 = *(long *)(sVar2 + 0x28);
          uVar12 = 0;
          bVar18 = false;
          do {
            iVar8 = (**(code **)(*(long *)*plVar17 + 0x10))();
            if (iVar8 == 0xc) {
              bVar18 = true;
            }
            else if (iVar8 == 2) {
              if (bVar18) {
                lVar16 = uVar12 * 8;
                while( true ) {
                  ppptVar4 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_finish._M_node;
                  ppptVar5 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node;
                  pptVar11 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_cur;
                  if (((long)(raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar11 >> 3)
                      + ((long)(raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                      ((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
                      (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <= uVar12) break;
                  uVar14 = ((long)pptVar11 -
                            (long)(raw->
                                  super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                  )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar12;
                  if ((long)uVar14 < 0) {
                    uVar13 = (long)uVar14 >> 6;
LAB_0012b625:
                    pptVar15 = ppptVar5[uVar13] + uVar14 + uVar13 * -0x40;
                  }
                  else {
                    if (0x3f < uVar14) {
                      uVar13 = uVar14 >> 6;
                      goto LAB_0012b625;
                    }
                    pptVar15 = (token_base **)((long)pptVar11 + lVar16);
                  }
                  iVar8 = (*(*pptVar15)->_vptr_token_base[2])();
                  pptVar11 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_cur;
                  ppptVar4 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node;
                  uVar13 = ((long)pptVar11 -
                            (long)(raw->
                                  super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                  )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar12;
                  uVar14 = (long)uVar13 >> 6;
                  if (iVar8 == 4) {
                    if ((long)uVar13 < 0) {
LAB_0012b69a:
                      pptVar15 = ppptVar4[uVar14] + uVar13 + uVar14 * -0x40;
                    }
                    else {
                      if (0x3f < uVar13) {
                        uVar14 = uVar13 >> 6;
                        goto LAB_0012b69a;
                      }
                      pptVar15 = (token_base **)((long)pptVar11 + lVar16);
                    }
                    ptVar6 = *pptVar15;
                    cVar9 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                                    *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3))
                    ;
                    if ((cVar9._M_node != (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) &&
                       (paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                  ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                           *)compiler_type::action_map_abi_cxx11_,
                                          (key_type *)(ptVar6 + 3)),
                       *paVar10 == *(action_types *)(*plVar17 + 0x10))) break;
                  }
                  else {
                    if ((long)uVar13 < 0) {
LAB_0012b6e6:
                      pptVar15 = ppptVar4[uVar14] + uVar13 + uVar14 * -0x40;
                    }
                    else {
                      if (0x3f < uVar13) {
                        uVar14 = uVar13 >> 6;
                        goto LAB_0012b6e6;
                      }
                      pptVar15 = (token_base **)((long)pptVar11 + lVar16);
                    }
                    iVar8 = (*(*pptVar15)->_vptr_token_base[2])();
                    if (iVar8 == 2) break;
                  }
                  uVar12 = uVar12 + 1;
                  lVar16 = lVar16 + 8;
                }
              }
              pptVar11 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar14 = ((long)pptVar11 -
                        (long)(raw->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar12;
              if ((long)uVar14 < 0) {
                uVar13 = (long)uVar14 >> 6;
LAB_0012b74e:
                pptVar11 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                           uVar14 + uVar13 * -0x40;
              }
              else {
                if (0x3f < uVar14) {
                  uVar13 = uVar14 >> 6;
                  goto LAB_0012b74e;
                }
                pptVar11 = pptVar11 + uVar12;
              }
              iVar8 = (*(*pptVar11)->_vptr_token_base[2])();
              if (iVar8 == 4) {
                pptVar11 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur;
                uVar14 = ((long)pptVar11 -
                          (long)(raw->
                                super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar12;
                if ((long)uVar14 < 0) {
                  uVar13 = (long)uVar14 >> 6;
LAB_0012b7a6:
                  pptVar11 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                             uVar14 + uVar13 * -0x40;
                }
                else {
                  if (0x3f < uVar14) {
                    uVar13 = uVar14 >> 6;
                    goto LAB_0012b7a6;
                  }
                  pptVar11 = pptVar11 + uVar12;
                }
                ptVar6 = *pptVar11;
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                                *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
                if (cVar9._M_node != (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) {
                  paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                            ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                     *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3)
                                   );
                  if (*paVar10 == *(action_types *)&((token_base *)*plVar17)[1]._vptr_token_base) {
                    pptVar11 = (raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_cur;
                    uVar14 = ((long)pptVar11 -
                              (long)(raw->
                                    super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                    )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) +
                             uVar12;
                    if ((long)uVar14 < 0) {
                      uVar13 = (long)uVar14 >> 6;
LAB_0012b81d:
                      pptVar11 = (raw->
                                 super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                 )._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                                 uVar14 + uVar13 * -0x40;
                    }
                    else {
                      if (0x3f < uVar14) {
                        uVar13 = uVar14 >> 6;
                        goto LAB_0012b81d;
                      }
                      pptVar11 = pptVar11 + uVar12;
                    }
                    *pptVar11 = (token_base *)*plVar17;
                  }
                }
              }
              uVar12 = uVar12 + 1;
              bVar18 = false;
            }
            plVar17 = plVar17 + 1;
            if (plVar17 == local_50) {
              plVar17 = *(long **)(local_58 + 8);
              local_58 = local_58 + 8;
              local_50 = plVar17 + 0x40;
            }
          } while (plVar17 != plVar3);
        }
      }
    }
    else {
      local_50 = *(long **)(sVar2 + 0x20);
      local_58 = *(long *)(sVar2 + 0x28);
      bVar18 = false;
      bVar7 = false;
      uVar14 = 0;
      do {
        iVar8 = (**(code **)(*(long *)*plVar17 + 0x10))();
        if (iVar8 == 0xc) {
          bVar7 = true;
        }
        else if (iVar8 == 2) {
          if (bVar7) {
            lVar16 = uVar14 * 8;
            while( true ) {
              ppptVar4 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_node;
              ppptVar5 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_node;
              pptVar11 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur;
              if (((long)(raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar11 >> 3) +
                  ((long)(raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)(raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                  ((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
                  (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <= uVar14) break;
              uVar12 = ((long)pptVar11 -
                        (long)(raw->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
              if ((long)uVar12 < 0) {
                uVar13 = (long)uVar12 >> 6;
LAB_0012b19b:
                pptVar15 = ppptVar5[uVar13] + uVar12 + uVar13 * -0x40;
              }
              else {
                if (0x3f < uVar12) {
                  uVar13 = uVar12 >> 6;
                  goto LAB_0012b19b;
                }
                pptVar15 = (token_base **)((long)pptVar11 + lVar16);
              }
              iVar8 = (*(*pptVar15)->_vptr_token_base[2])();
              pptVar11 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur;
              ppptVar4 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_node;
              uVar13 = ((long)pptVar11 -
                        (long)(raw->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
              uVar12 = (long)uVar13 >> 6;
              if (iVar8 == 4) {
                if ((long)uVar13 < 0) {
LAB_0012b210:
                  pptVar15 = ppptVar4[uVar12] + uVar13 + uVar12 * -0x40;
                }
                else {
                  if (0x3f < uVar13) {
                    uVar12 = uVar13 >> 6;
                    goto LAB_0012b210;
                  }
                  pptVar15 = (token_base **)((long)pptVar11 + lVar16);
                }
                ptVar6 = *pptVar15;
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                                *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
                if ((cVar9._M_node != (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) &&
                   (paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                              ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                       *)compiler_type::action_map_abi_cxx11_,
                                      (key_type *)(ptVar6 + 3)),
                   *paVar10 == *(action_types *)(*plVar17 + 0x10))) break;
              }
              else {
                if ((long)uVar13 < 0) {
LAB_0012b25b:
                  pptVar15 = ppptVar4[uVar12] + uVar13 + uVar12 * -0x40;
                }
                else {
                  if (0x3f < uVar13) {
                    uVar12 = uVar13 >> 6;
                    goto LAB_0012b25b;
                  }
                  pptVar15 = (token_base **)((long)pptVar11 + lVar16);
                }
                iVar8 = (*(*pptVar15)->_vptr_token_base[2])();
                if (iVar8 == 2) break;
              }
              uVar14 = uVar14 + 1;
              lVar16 = lVar16 + 8;
            }
          }
          ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_node;
          ppptVar5 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_node;
          pptVar11 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = uVar14;
          if (((long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar11 >> 3) +
              ((long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
              (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <= uVar14) break;
          uVar12 = ((long)pptVar11 -
                    (long)(raw->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
          if ((long)uVar12 < 0) {
            uVar13 = (long)uVar12 >> 6;
LAB_0012b30a:
            pptVar15 = ppptVar5[uVar13] + uVar12 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar12) {
              uVar13 = uVar12 >> 6;
              goto LAB_0012b30a;
            }
            pptVar15 = pptVar11 + uVar14;
          }
          iVar8 = (*(*pptVar15)->_vptr_token_base[2])();
          pptVar11 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_cur;
          ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_node;
          uVar13 = ((long)pptVar11 -
                    (long)(raw->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
          uVar12 = (long)uVar13 >> 6;
          if (iVar8 == 4) {
            if ((long)uVar13 < 0) {
LAB_0012b37e:
              pptVar11 = ppptVar4[uVar12] + uVar13 + uVar12 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar12 = uVar13 >> 6;
                goto LAB_0012b37e;
              }
              pptVar11 = pptVar11 + uVar14;
            }
            ptVar6 = *pptVar11;
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                            *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
            if (cVar9._M_node == (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) {
              bVar18 = false;
LAB_0012b4fd:
              uVar12 = uVar14 + 1;
              goto LAB_0012b500;
            }
            paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                      ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                               *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
            uVar12 = uVar14 + 1;
            bVar18 = *paVar10 == *(action_types *)(*plVar17 + 0x10);
            if (!bVar18) goto LAB_0012b500;
          }
          else {
            if ((long)uVar13 < 0) {
LAB_0012b3df:
              pptVar11 = ppptVar4[uVar12] + uVar13 + uVar12 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar12 = uVar13 >> 6;
                goto LAB_0012b3df;
              }
              pptVar11 = pptVar11 + uVar14;
            }
            iVar8 = (*(*pptVar11)->_vptr_token_base[2])();
            if (iVar8 != 2) goto LAB_0012b4fd;
            pptVar11 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar12 = ((long)pptVar11 -
                      (long)(raw->
                            super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
            if ((long)uVar12 < 0) {
              uVar13 = (long)uVar12 >> 6;
LAB_0012b437:
              pptVar11 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                         uVar12 + uVar13 * -0x40;
            }
            else {
              if (0x3f < uVar12) {
                uVar13 = uVar12 >> 6;
                goto LAB_0012b437;
              }
              pptVar11 = pptVar11 + uVar14;
            }
            uVar12 = uVar14 + 1;
            if (*(int *)&(*pptVar11)[1]._vptr_token_base != *(int *)(*plVar17 + 0x10))
            goto LAB_0012b500;
          }
          uVar14 = uVar14 + 1;
          bVar7 = false;
        }
        plVar17 = plVar17 + 1;
        if (plVar17 == local_50) {
          plVar17 = *(long **)(local_58 + 8);
          local_58 = local_58 + 8;
          local_50 = plVar17 + 0x40;
        }
        uVar12 = uVar14;
      } while (plVar17 != plVar3);
      if (!bVar7) goto LAB_0012b500;
      ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if ((bool)(bVar18 & uVar12 != ((long)(raw->
                                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                           )._M_impl.super__Deque_impl_data._M_start._M_last -
                                     (long)(raw->
                                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                           )._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                                    ((long)(raw->
                                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                           )._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                     (long)(raw->
                                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                           )._M_impl.super__Deque_impl_data._M_finish._M_first >> 3)
                                    + ((((ulong)((long)ppptVar4 -
                                                (long)(raw->
                                                  super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                                  )._M_impl.super__Deque_impl_data._M_start._M_node)
                                        >> 3) - 1) + (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40)
         ) goto LAB_0012b54c;
    }
    p_Var1 = (((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                *)&p_Var1->_M_next)->
             super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

void translator_type::match_grammar(const context_t &context, std::deque<token_base *> &raw)
	{
		for (auto &dat: m_data) {
			bool matched = false;
			{
				bool failed = false, skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (i >= raw.size()) {
							failed = true;
							break;
						}
						// The "matched" condition is satisfied only if the target token is an id and it can match the grammar rule.
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (!context->compiler->action_map.exist(id) ||
							        context->compiler->action_map.match(id) !=
							        static_cast<token_action *>(it)->get_action()) {
								matched = false;
								failed = true;
							}
							else
								matched = true;
						}
						else if (raw[i]->get_type() == token_types::action)
							failed = static_cast<token_action *>(raw[i])->get_action() !=
							         static_cast<token_action *>(it)->get_action();
						else
							failed = true;
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
					if (failed)
						break;
				}
				if ((skip_useless && i == raw.size()) || (!skip_useless && i < raw.size()))
					matched = false;
			}
			if (matched) {
				// If matched, find and replace all id token with correspondent action token.
				bool skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (context->compiler->action_map.exist(id) &&
							        context->compiler->action_map.match(id) ==
							        static_cast<token_action *>(it)->get_action())
								raw[i] = it;
						}
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
				}
			}
		}
	}